

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

Ptr __thiscall core::image::load_ppm_file_intern(image *this,string *filename,bool bit8)

{
  byte bVar1;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  FileException *this_00;
  int *piVar6;
  void *pvVar7;
  Exception *pEVar8;
  element_type *peVar9;
  undefined4 extraout_var;
  element_type *peVar10;
  undefined4 extraout_var_00;
  TypedImageBase<unsigned_short> *this_01;
  unsigned_short *puVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar12;
  allocator local_2e9;
  string local_2e8 [36];
  int local_2c4;
  undefined1 local_2c0 [4];
  int i;
  Ptr image_1;
  Ptr image;
  string local_298 [39];
  undefined1 local_271;
  int local_270;
  int iStack_26c;
  char temp;
  int maxval;
  int height;
  int width;
  int local_23c;
  char local_236;
  char local_235;
  int channels;
  char signature [2];
  char local_228 [8];
  ifstream in;
  bool bit8_local;
  string *filename_local;
  Ptr *ret;
  
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,pcVar5,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar6 = __errno_location();
    pcVar5 = strerror(*piVar6);
    util::FileException::FileException(this_00,filename,pcVar5);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  std::istream::read(local_228,(long)&local_236);
  local_23c = 0;
  if ((local_236 == 'P') && (local_235 == '5')) {
    local_23c = 1;
  }
  else {
    if ((local_236 != 'P') || (local_235 != '6')) {
      std::ifstream::close();
      height._2_1_ = 1;
      pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&width,"PPM signature did not match",(allocator *)((long)&height + 3));
      util::Exception::Exception(pEVar8,(string *)&width);
      height._2_1_ = 0;
      __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    local_23c = 3;
  }
  maxval = 0;
  iStack_26c = 0;
  local_270 = 0;
  pvVar7 = (void *)std::istream::operator>>(local_228,&maxval);
  pvVar7 = (void *)std::istream::operator>>(pvVar7,&stack0xfffffffffffffd94);
  std::istream::operator>>(pvVar7,&local_270);
  std::istream::read(local_228,(long)&local_271);
  if (0x10000000 < maxval * iStack_26c) {
    std::ifstream::close();
    image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._6_1_ = 1;
    pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_298,"Image too friggin huge",
               (allocator *)
               ((long)&image.
                       super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    util::Exception::Exception(pEVar8,(string *)local_298);
    image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._6_1_ = 0;
    __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._5_1_ = 0;
  std::shared_ptr<core::ImageBase>::shared_ptr((shared_ptr<core::ImageBase> *)this);
  if ((local_270 < 0x100) && (bit8)) {
    Image<unsigned_char>::create
              ((Image<unsigned_char> *)
               &image_1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,maxval,iStack_26c,local_23c);
    peVar9 = std::
             __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&image_1.
                              super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    iVar3 = (*(peVar9->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase[5])();
    peVar9 = std::
             __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&image_1.
                              super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    (*(peVar9->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase[3])();
    std::istream::read(local_228,CONCAT44(extraout_var,iVar3));
    std::shared_ptr<core::ImageBase>::operator=
              ((shared_ptr<core::ImageBase> *)this,
               (shared_ptr<core::Image<unsigned_char>_> *)
               &image_1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
              ((shared_ptr<core::Image<unsigned_char>_> *)
               &image_1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    if ((0xffff < local_270) || (bit8)) {
      std::ifstream::close();
      pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"PPM max value is invalid",&local_2e9);
      util::Exception::Exception(pEVar8,(string *)local_2e8);
      __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    Image<unsigned_short>::create((Image<unsigned_short> *)local_2c0,maxval,iStack_26c,local_23c);
    peVar10 = std::
              __shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_2c0);
    iVar3 = (*(peVar10->super_TypedImageBase<unsigned_short>).super_ImageBase._vptr_ImageBase[5])();
    peVar10 = std::
              __shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_2c0);
    (*(peVar10->super_TypedImageBase<unsigned_short>).super_ImageBase._vptr_ImageBase[3])();
    std::istream::read(local_228,CONCAT44(extraout_var_00,iVar3));
    local_2c4 = 0;
    while( true ) {
      iVar3 = local_2c4;
      this_01 = &std::
                 __shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2c0)->super_TypedImageBase<unsigned_short>;
      iVar4 = TypedImageBase<unsigned_short>::get_value_amount(this_01);
      if (iVar4 <= iVar3) break;
      peVar10 = std::
                __shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_2c0);
      puVar11 = Image<unsigned_short>::at(peVar10,local_2c4);
      uVar2 = util::system::betoh<unsigned_short>(puVar11);
      peVar10 = std::
                __shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_2c0);
      puVar11 = Image<unsigned_short>::at(peVar10,local_2c4);
      *puVar11 = uVar2;
      local_2c4 = local_2c4 + 1;
    }
    std::shared_ptr<core::ImageBase>::operator=
              ((shared_ptr<core::ImageBase> *)this,
               (shared_ptr<core::Image<unsigned_short>_> *)local_2c0);
    std::shared_ptr<core::Image<unsigned_short>_>::~shared_ptr
              ((shared_ptr<core::Image<unsigned_short>_> *)local_2c0);
  }
  std::ifstream::close();
  image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._5_1_ = 1;
  std::ifstream::~ifstream(local_228);
  PVar12.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar12.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar12.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImageBase::Ptr
load_ppm_file_intern (std::string const& filename, bool bit8)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw util::FileException(filename, std::strerror(errno));

    char signature[2];
    in.read(signature, 2);

    // check signature and determine channels
    int channels = 0;
    if (signature[0] == 'P' && signature[1] == '5')
        channels = 1;
    else if (signature[0] == 'P' && signature[1] == '6')
        channels = 3;
    else
    {
        in.close();
        throw util::Exception("PPM signature did not match");
    }

    /* Read width and height as well as max value. */
    int width = 0;
    int height = 0;
    int maxval = 0;
    in >> width >> height >> maxval;

    /* Read final whitespace character. */
    char temp;
    in.read(&temp, 1);

    /* Check image width and height. Shouldn't be too large. */
    if (width * height > PPM_MAX_PIXEL_AMOUNT)
    {
        in.close();
        throw util::Exception("Image too friggin huge");
    }

    ImageBase::Ptr ret;

    /* Max value should be in <256 for 8 bit and <65535 for 16 bit. */
    if (maxval < 256 && bit8)
    {
        /* Read image content. */
        ByteImage::Ptr image = ByteImage::create(width, height, channels);
        in.read(image->get_byte_pointer(), image->get_byte_size());
        ret = image;
    }
    else if (maxval < 65536 && !bit8)
    {
        /* Read image content, convert from big-endian to host order. */
        RawImage::Ptr image = RawImage::create(width, height, channels);
        in.read(image->get_byte_pointer(), image->get_byte_size());
        for (int i = 0; i < image->get_value_amount(); ++i)
            image->at(i) = util::system::betoh(image->at(i));
        ret = image;
    }
    else
    {
        in.close();
        throw util::Exception("PPM max value is invalid");
    }

    in.close();
    return ret;
}